

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O1

void llama_kv_cache_view_update(llama_kv_cache_view *view,llama_kv_cache *kv)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  llama_kv_cache_view_cell *plVar5;
  llama_seq_id *plVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  _Rb_tree_node_base *p_Var17;
  uint local_5c;
  uint local_58;
  int local_38;
  
  if (kv == (llama_kv_cache *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(kv,&llama_kv_cache::typeinfo,&llama_kv_cache_unified::typeinfo,0);
  }
  if (lVar4 == 0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: the kv_cache_view currently works only with llama_kv_cache_unified\n",
                       "llama_kv_cache_view_update");
    return;
  }
  uVar11 = *(uint *)(lVar4 + 0x6c);
  if ((uVar11 <= (uint)view->n_cells) && (view->cells != (llama_kv_cache_view_cell *)0x0)) {
LAB_001b1f50:
    if (*(int *)(lVar4 + 0x6c) < 1) {
      uVar11 = 0xffffffff;
      iVar15 = 0;
      iVar13 = 0;
      local_5c = 0;
      local_58 = 0xffffffff;
    }
    else {
      plVar5 = view->cells;
      plVar6 = view->cells_sequences;
      lVar8 = *(long *)(lVar4 + 0x78);
      lVar12 = 0;
      local_58 = 0xffffffff;
      local_5c = 0;
      uVar11 = 0xffffffff;
      iVar13 = 0;
      iVar15 = 0;
      do {
        lVar16 = lVar12 * 0x40;
        lVar1 = *(long *)(lVar8 + 0x38 + lVar16);
        plVar5->pos = *(int *)(lVar8 + 4 + lVar16) + *(int *)(lVar8 + lVar16);
        if (lVar1 == 0) {
          if ((int)uVar11 < 0) {
            uVar11 = (uint)lVar12;
          }
        }
        else {
          if ((-1 < (int)uVar11) && (uVar2 = (uint)lVar12 - uVar11, local_5c < uVar2)) {
            local_5c = uVar2;
            local_58 = uVar11;
          }
          uVar11 = 0xffffffff;
        }
        p_Var7 = *(_Rb_tree_node_base **)(lVar16 + lVar8 + 0x28);
        p_Var17 = (_Rb_tree_node_base *)(lVar16 + lVar8 + 0x18);
        if (p_Var7 == p_Var17) {
          iVar9 = 0;
        }
        else {
          iVar9 = 0;
          do {
            if (view->n_seq_max <= iVar9) break;
            plVar6[iVar9] = p_Var7[1]._M_color;
            iVar9 = iVar9 + 1;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          } while (p_Var7 != p_Var17);
        }
        iVar15 = (iVar15 + 1) - (uint)(iVar9 == 0);
        iVar3 = view->n_seq_max;
        if (iVar9 < iVar3) {
          lVar16 = (long)iVar9;
          do {
            plVar6[lVar16] = -1;
            lVar16 = lVar16 + 1;
            iVar3 = view->n_seq_max;
          } while (lVar16 < iVar3);
        }
        local_38 = (int)lVar1;
        iVar13 = iVar13 + local_38;
        lVar12 = lVar12 + 1;
        plVar5 = plVar5 + 1;
        plVar6 = plVar6 + iVar3;
      } while (lVar12 < *(int *)(lVar4 + 0x6c));
    }
    if ((-1 < (int)uVar11) &&
       (lVar8 = *(long *)(lVar4 + 0x80) - *(long *)(lVar4 + 0x78) >> 6,
       (ulong)local_5c < lVar8 - (ulong)uVar11)) {
      local_5c = (int)lVar8 - uVar11;
      local_58 = uVar11;
    }
    view->max_contiguous = local_5c;
    view->max_contiguous_idx = local_58;
    view->token_count = iVar13;
    view->used_cells = iVar15;
    if (iVar15 != *(int *)(lVar4 + 0x70)) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: used cells mismatch. kv_cache says %d but we calculated %d\n",
                         "llama_kv_cache_view_update");
      return;
    }
    return;
  }
  view->n_cells = uVar11;
  plVar5 = (llama_kv_cache_view_cell *)realloc(view->cells,(long)(int)uVar11 << 2);
  if (plVar5 == (llama_kv_cache_view_cell *)0x0) {
    pcVar10 = "p != nullptr && \"Failed to alloc kv_cache_view cells\"";
    uVar14 = 0x52a;
  }
  else {
    view->cells = plVar5;
    plVar6 = (llama_seq_id *)
             realloc(view->cells_sequences,(long)view->n_cells * (long)view->n_seq_max * 4);
    if (plVar6 != (llama_seq_id *)0x0) {
      view->cells_sequences = plVar6;
      goto LAB_001b1f50;
    }
    pcVar10 = "p != nullptr && \"Failed to alloc kv_cache_view cells sequences\"";
    uVar14 = 0x52d;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
             ,uVar14,"GGML_ASSERT(%s) failed",pcVar10);
}

Assistant:

void llama_kv_cache_view_update(llama_kv_cache_view * view, const llama_kv_cache * kv) {
    // TODO: rework this in the future, for now quick hack
    const llama_kv_cache_unified * kvu = dynamic_cast<const llama_kv_cache_unified *>(kv);
    if (kvu == nullptr) {
        LLAMA_LOG_ERROR("%s: the kv_cache_view currently works only with llama_kv_cache_unified\n", __func__);
        return;
    }

    if (uint32_t(view->n_cells) < kvu->size || view->cells == nullptr) {
        view->n_cells = int32_t(kvu->size);
        void * p = realloc(view->cells, sizeof(llama_kv_cache_view_cell) * view->n_cells);
        GGML_ASSERT(p != nullptr && "Failed to alloc kv_cache_view cells");
        view->cells = (llama_kv_cache_view_cell *)p;
        p = realloc(view->cells_sequences, sizeof(llama_seq_id) * view->n_seq_max * view->n_cells);
        GGML_ASSERT(p != nullptr && "Failed to alloc kv_cache_view cells sequences");
        view->cells_sequences = (llama_seq_id *)p;
    }

    const std::vector<llama_kv_cell> & kv_cells = kvu->cells;
    llama_kv_cache_view_cell * c_curr = view->cells;
    llama_seq_id * cs_curr = view->cells_sequences;
    int32_t used_cells = 0;
    int32_t token_count = 0;
    int32_t curr_contig_idx = -1;
    uint32_t max_contig = 0;
    int32_t max_contig_idx = -1;

    for (int32_t i = 0; i < int32_t(kvu->size); i++, c_curr++, cs_curr += view->n_seq_max) {
        const size_t curr_size = kv_cells[i].seq_id.size();
        token_count += curr_size;
        c_curr->pos = kv_cells[i].pos + kv_cells[i].delta;

        if (curr_size > 0) {
            if (curr_contig_idx >= 0 && uint32_t(i - curr_contig_idx) > max_contig) {
                max_contig = i - curr_contig_idx;
                max_contig_idx = curr_contig_idx;
            }
            curr_contig_idx = -1;
        } else if (curr_contig_idx < 0) {
            curr_contig_idx = i;
        }

        int seq_idx = 0;
        for (const llama_seq_id it : kv_cells[i].seq_id) {
            if (seq_idx >= view->n_seq_max) {
                break;
            }
            cs_curr[seq_idx] = it;
            seq_idx++;
        }
        if (seq_idx != 0) {
            used_cells++;
        }
        for (; seq_idx < view->n_seq_max; seq_idx++) {
            cs_curr[seq_idx] = -1;
        }
    }
    if (curr_contig_idx >= 0 && kv_cells.size() - curr_contig_idx > max_contig) {
        max_contig_idx = curr_contig_idx;
        max_contig = kv_cells.size() - curr_contig_idx;
    }
    view->max_contiguous = max_contig;
    view->max_contiguous_idx = max_contig_idx;
    view->token_count = token_count;
    view->used_cells = used_cells;
    if (uint32_t(used_cells) != kvu->used) {
        LLAMA_LOG_ERROR("%s: used cells mismatch. kv_cache says %d but we calculated %d\n",
            __func__, kvu->used, used_cells);
    }
}